

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

void Bmc_MnaSelect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves)

{
  int iVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  do {
    uVar5 = *(ulong *)pObj;
    if (-1 < (long)uVar5) {
      return;
    }
    uVar2 = uVar5 & 0x7fffffffffffffff;
    *(ulong *)pObj = uVar2;
    if (pObj->Value != 3) {
      __assert_fail("pObj->Value == GIA_UND",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0xc0,"void Bmc_MnaSelect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    uVar4 = (uint)uVar5;
    if (((int)uVar4 < 0) || (uVar6 = uVar4 & 0x1fffffff, uVar6 == 0x1fffffff)) {
      iVar1 = Gia_ObjIsRo(p,pObj);
      if (iVar1 == 0) {
        return;
      }
      pGVar3 = Gia_ObjRoToRi(p,pObj);
      iVar1 = Gia_ObjId(p,pGVar3);
      Vec_IntPush(vLeaves,iVar1);
      return;
    }
    if (pObj[-(ulong)uVar6].Value == 3) {
      Bmc_MnaSelect_rec(p,pObj + -(ulong)uVar6,vLeaves);
      uVar2 = *(ulong *)pObj;
    }
    else if (pObj[-(ulong)uVar6].Value + (uint)((uVar4 >> 0x1d & 1) != 0) != 2) {
      __assert_fail("Gia_ObjFanin0(pObj)->Value + Gia_ObjFaninC0(pObj) == GIA_ONE",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0xc5,"void Bmc_MnaSelect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    uVar5 = (ulong)((uint)(uVar2 >> 0x20) & 0x1fffffff);
    pGVar3 = pObj + -uVar5;
    pObj = pObj + -uVar5;
  } while (pGVar3->Value == 3);
  if (pGVar3->Value + (uint)((uVar2 >> 0x3d & 1) != 0) == 2) {
    return;
  }
  __assert_fail("Gia_ObjFanin1(pObj)->Value + Gia_ObjFaninC1(pObj) == GIA_ONE",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                ,200,"void Bmc_MnaSelect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Bmc_MnaSelect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves )
{
    if ( !pObj->fPhase )
        return;
    pObj->fPhase = 0;
    assert( pObj->Value == GIA_UND );
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            Bmc_MnaSelect_rec( p, Gia_ObjFanin0(pObj), vLeaves );
        else assert( Gia_ObjFanin0(pObj)->Value + Gia_ObjFaninC0(pObj) == GIA_ONE );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            Bmc_MnaSelect_rec( p, Gia_ObjFanin1(pObj), vLeaves );
        else assert( Gia_ObjFanin1(pObj)->Value + Gia_ObjFaninC1(pObj) == GIA_ONE );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vLeaves, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
}